

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

uchar * extra_next_record(ctl_extr_rec *ctl,int length)

{
  isoent *piVar1;
  extr_rec **ppeVar2;
  extr_rec *peVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = ctl->cur_len;
  extra_close_record(ctl,0x1c);
  ctl->use_extr = 1;
  if (ctl->bp != (uchar *)0x0) {
    ctl->ce_ptr = ctl->bp + (long)iVar5 + 1;
    piVar1 = ctl->isoent->parent;
    peVar3 = (piVar1->extr_rec_list).current;
    iVar5 = peVar3->offset;
    if (0x7e4 < iVar5) {
      peVar3 = peVar3->next;
      iVar5 = peVar3->offset;
    }
    uVar4 = 0x7e3 - iVar5;
    if ((0x7e4U - iVar5 & 1) == 0) {
      uVar4 = 0x7e4U - iVar5;
    }
    ctl->limit = uVar4;
    ctl->extr_off = peVar3->offset;
    ctl->extr_loc = peVar3->location;
    (piVar1->extr_rec_list).current = peVar3;
    ctl->bp = peVar3->buf + (long)peVar3->offset + -1;
    goto LAB_00509aba;
  }
  piVar1 = ctl->isoent->parent;
  if ((piVar1->extr_rec_list).first == (extr_rec *)0x0) {
LAB_00509a58:
    peVar3 = (extr_rec *)malloc(0x810);
    if (peVar3 == (extr_rec *)0x0) {
      uVar4 = ctl->limit;
      goto LAB_00509aba;
    }
    iVar5 = 0;
    *(extr_rec **)peVar3 = (extr_rec *)0x0;
    peVar3->next = (extr_rec *)0x0;
    *(piVar1->extr_rec_list).last = peVar3;
    (piVar1->extr_rec_list).last = &peVar3->next;
  }
  else {
    ppeVar2 = (piVar1->extr_rec_list).last;
    iVar5 = *(int *)((long)ppeVar2 + -0x804);
    if (0x7e4 < iVar5) goto LAB_00509a58;
    peVar3 = (extr_rec *)(ppeVar2 + -0x101);
  }
  uVar4 = 0x7e3 - iVar5;
  if ((0x7e4U - iVar5 & 1) == 0) {
    uVar4 = 0x7e4U - iVar5;
  }
  ctl->limit = uVar4;
  (piVar1->extr_rec_list).current = peVar3;
LAB_00509aba:
  ctl->cur_len = 0;
  if ((int)uVar4 < length) {
    extra_next_record(ctl,length);
  }
  return ctl->bp;
}

Assistant:

static unsigned char *
extra_next_record(struct ctl_extr_rec *ctl, int length)
{
	int cur_len = ctl->cur_len;/* save cur_len */

	/* Close the current extra record or Directory Record. */
	extra_close_record(ctl, RR_CE_SIZE);

	/* Get a next extra record. */
	ctl->use_extr = 1;
	if (ctl->bp != NULL) {
		/* Storing data into an extra record. */
		unsigned char *p;

		/* Save the pointer where a CE extension will be
		 * stored to. */
		ctl->ce_ptr = &ctl->bp[cur_len+1];
		p = extra_get_record(ctl->isoent,
		    &ctl->limit, &ctl->extr_off, &ctl->extr_loc);
		ctl->bp = p - 1;/* the base of bp offset is 1. */
	} else
		/* Calculating the size of an extra record. */
		(void)extra_get_record(ctl->isoent,
		    &ctl->limit, NULL, NULL);
	ctl->cur_len = 0;
	/* Check if an extra record is almost full.
	 * If so, get a next one. */
	if (extra_space(ctl) < length)
		(void)extra_next_record(ctl, length);

	return (ctl->bp);
}